

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall flatbuffers::Parser::ParseNamespacing(Parser *this,string *id,string *last)

{
  bool bVar1;
  string *in_RCX;
  string *last_local;
  string *id_local;
  Parser *this_local;
  CheckedError *ce;
  
  while (bVar1 = Is((Parser *)id,0x2e), bVar1) {
    Next(this);
    bVar1 = CheckedError::Check((CheckedError *)this);
    if (bVar1) goto LAB_0010856e;
    CheckedError::~CheckedError((CheckedError *)this);
    std::__cxx11::string::operator+=((string *)last,".");
    std::__cxx11::string::operator+=((string *)last,(string *)&id[1]._M_string_length);
    if (in_RCX != (string *)0x0) {
      std::__cxx11::string::operator=(in_RCX,(string *)&id[1]._M_string_length);
    }
    Expect(this,(int)id);
    bVar1 = CheckedError::Check((CheckedError *)this);
    if (bVar1) goto LAB_0010856e;
    CheckedError::~CheckedError((CheckedError *)this);
  }
  anon_unknown_0::NoError();
LAB_0010856e:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseNamespacing(std::string *id, std::string *last) {
  while (Is('.')) {
    NEXT();
    *id += ".";
    *id += attribute_;
    if (last) *last = attribute_;
    EXPECT(kTokenIdentifier);
  }
  return NoError();
}